

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O0

void tokinclude(tokcxdef *ctx,char *p,int len)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  errcxdef *peVar7;
  char *pcVar8;
  linfdef *plVar9;
  int in_EDX;
  char *in_RSI;
  undefined8 *in_RDI;
  char *p_1;
  size_t flen2;
  char *q;
  linfdef *lin;
  int flen;
  int match;
  char *fname;
  tokpdef *path;
  linfdef *child;
  int in_stack_00000fd4;
  tokpdef *in_stack_00000fd8;
  int in_stack_00000fe4;
  char *in_stack_00000fe8;
  errcxdef *in_stack_00000ff0;
  mcmcxdef *in_stack_00000ff8;
  int in_stack_00001010;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffffa0;
  byte in_stack_ffffffffffffffa1;
  undefined1 in_stack_ffffffffffffffa2;
  byte bVar10;
  undefined1 in_stack_ffffffffffffffa3;
  undefined1 uVar11;
  undefined4 in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  errcxdef *ctx_00;
  char *local_48;
  long local_40;
  size_t in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (in_EDX == 0) {
    errlogf((errcxdef *)
            CONCAT44(in_stack_ffffffffffffffa4,
                     CONCAT13(in_stack_ffffffffffffffa3,
                              CONCAT12(in_stack_ffffffffffffffa2,
                                       CONCAT11(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0)
                                      ))),
            (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
  }
  else {
    iVar2 = (int)*in_RSI;
    if (iVar2 == 0x22) {
      cVar1 = '\"';
    }
    else {
      if (iVar2 != 0x3c) {
        errlogf((errcxdef *)
                CONCAT44(iVar2,CONCAT13(in_stack_ffffffffffffffa3,
                                        CONCAT12(in_stack_ffffffffffffffa2,
                                                 CONCAT11(in_stack_ffffffffffffffa1,
                                                          in_stack_ffffffffffffffa0)))),
                (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
        return;
      }
      cVar1 = '>';
    }
    local_48 = in_RSI + 1;
    iVar3 = in_EDX + -1;
    while( true ) {
      uVar11 = false;
      if (iVar3 != 0) {
        uVar11 = *local_48 != cVar1;
      }
      if ((bool)uVar11 == false) break;
      iVar3 = iVar3 + -1;
      local_48 = local_48 + 1;
    }
    if ((iVar3 == 0) || (*local_48 != cVar1)) {
      errlogf((errcxdef *)
              CONCAT44(iVar2,(uint)CONCAT12(in_stack_ffffffffffffffa2,
                                            CONCAT11(in_stack_ffffffffffffffa1,
                                                     in_stack_ffffffffffffffa0))),
              (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    }
    ctx_00 = (errcxdef *)0x0;
    pcVar8 = local_48;
    while( true ) {
      bVar10 = 0;
      if ((in_RSI + 1 < local_48) && (bVar10 = 0, local_48[-1] != '/')) {
        pcVar5 = strchr("",(int)local_48[-1]);
        bVar10 = pcVar5 != (char *)0x0 ^ 0xff;
      }
      if ((bVar10 & 1) == 0) break;
      local_48 = local_48 + -1;
      ctx_00 = (errcxdef *)((long)&ctx_00->errcxptr + 1);
    }
    for (local_40 = in_RDI[0x9f]; local_40 != 0; local_40 = *(long *)(local_40 + 0xb0)) {
      in_stack_ffffffffffffffa8 = (char *)(local_40 + 0x268);
      sVar6 = strlen(in_stack_ffffffffffffffa8);
      in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 + sVar6;
      while( true ) {
        in_stack_ffffffffffffffa1 = 0;
        if (((char *)(local_40 + 0x268) < in_stack_ffffffffffffffa8) &&
           (in_stack_ffffffffffffffa1 = 0, in_stack_ffffffffffffffa8[-1] != '/')) {
          pcVar5 = strchr("",(int)in_stack_ffffffffffffffa8[-1]);
          in_stack_ffffffffffffffa1 = pcVar5 != (char *)0x0 ^ 0xff;
        }
        if ((in_stack_ffffffffffffffa1 & 1) == 0) break;
        in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 + -1;
      }
      peVar7 = (errcxdef *)strlen(in_stack_ffffffffffffffa8);
      if ((peVar7 == ctx_00) &&
         (iVar4 = memicmp(pcVar8,(void *)CONCAT44(iVar3,in_stack_ffffffffffffffe8),
                          in_stack_ffffffffffffffe0), iVar4 == 0)) {
        pcVar8 = errstr(ctx_00,in_stack_ffffffffffffffa8,iVar2);
        *(char **)(*(long *)*in_RDI + 0x18) = pcVar8;
        *(undefined4 *)(*(long *)*in_RDI + 0x68) = 1;
        errlogn((errcxdef *)
                CONCAT44(iVar2,CONCAT13(uVar11,CONCAT12(bVar10,CONCAT11(in_stack_ffffffffffffffa1,
                                                                        in_stack_ffffffffffffffa0)))
                        ),in_stack_ffffffffffffff9c,(char *)0x11ff55);
        return;
      }
    }
    plVar9 = linfini(in_stack_00000ff8,in_stack_00000ff0,in_stack_00000fe8,in_stack_00000fe4,
                     in_stack_00000fd8,in_stack_00000fd4,in_stack_00001010);
    if (plVar9 == (linfdef *)0x0) {
      pcVar8 = errstr(ctx_00,in_stack_ffffffffffffffa8,iVar2);
      *(char **)(*(long *)*in_RDI + 0x18) = pcVar8;
      *(undefined4 *)(*(long *)*in_RDI + 0x68) = 1;
      errsign((errcxdef *)
              CONCAT44(iVar2,CONCAT13(uVar11,CONCAT12(bVar10,CONCAT11(in_stack_ffffffffffffffa1,
                                                                      in_stack_ffffffffffffffa0)))),
              in_stack_ffffffffffffff9c,(char *)0x120018);
    }
    (plVar9->linflin).linnxt = (lindef *)in_RDI[0x9f];
    in_RDI[0x9f] = plVar9;
    if (in_RDI[2] != 0) {
      *(linfdef **)(in_RDI[2] + 0x20) = plVar9;
      iVar2 = *(int *)(in_RDI[2] + 0x30);
      *(int *)(in_RDI[2] + 0x30) = iVar2 + 1;
      (plVar9->linflin).linid = iVar2;
    }
    if ((*(uint *)((long)in_RDI + 0x11c) & 4) == 0) {
      *(ushort *)(in_RDI[3] + 200) = *(ushort *)(in_RDI[3] + 200) & 0xffef;
    }
    else {
      *(ushort *)(in_RDI[3] + 200) = *(ushort *)(in_RDI[3] + 200) | 0x10;
    }
    (plVar9->linflin).linpar = (lindef *)in_RDI[3];
    in_RDI[3] = plVar9;
  }
  return;
}

Assistant:

static void tokinclude(tokcxdef *ctx, char *p, int len)
{
    linfdef *child;
    tokpdef *path;
    char    *fname;
    int      match;
    int      flen;
    linfdef *lin;
    char    *q;
    size_t   flen2;

    /* find the filename portion */
    fname = p + 1;                            /* remember start of filename */
    path = ctx->tokcxinc;                    /* start with first path entry */

    if (!len)
    {
        errlog(ctx->tokcxerr, ERR_INCNOFN);
        return;
    }
    
    switch(*p)
    {
    case '<':
        match = '>';
        if (path && path->tokpnxt) path = path->tokpnxt;   /* skip 1st path */
        goto find_matching_delim;

    case '"':
        match = '"';

    find_matching_delim:
        for (++p, --len ; len && *p != match ; --len, ++p) ;
        if (len == 0 || *p != match) errlog(ctx->tokcxerr, ERR_INCMTCH);
        break;
        
    default:
        errlog(ctx->tokcxerr, ERR_INCSYN);
        return;
    }
    
    flen = p - fname;                         /* compute length of filename */
    for (q = p, flen2 = 0 ;
         q > fname && *(q-1) != OSPATHCHAR && !strchr(OSPATHALT, *(q-1)) ;
         --q, ++flen2) ;
    
    /* check to see if this file has already been included */
    for (lin = ctx->tokcxhdr ; lin ; lin = (linfdef *)lin->linflin.linnxt)
    {
        char *p = lin->linfnam;
        
        p += strlen(p);
        
        while (p > lin->linfnam && *(p-1) != OSPATHCHAR
               && !strchr(OSPATHALT, *(p-1)))
            --p;
        if (strlen(p) == flen2
            && !memicmp(p, q, flen2))
        {
            errlog1(ctx->tokcxerr, ERR_INCRPT, ERRTSTR,
                    errstr(ctx->tokcxerr, fname, flen));
            return;
        }
    }
    
    /* initialize the line source */
    child = linfini(ctx->tokcxmem, ctx->tokcxerr, fname, flen, path, TRUE,
                    (ctx->tokcxflg & TOKCXFLIN2) != 0);
    
    /* if not found, signal an error */
    if (!child) errsig1(ctx->tokcxerr, ERR_INCSEAR,
                        ERRTSTR, errstr(ctx->tokcxerr, fname, flen));
    
    /* link into tokenizer list of line records */
    child->linflin.linnxt = (lindef *)ctx->tokcxhdr;
    ctx->tokcxhdr = child;

    /* if we're tracking sources for debugging, add into the chain */
    if (ctx->tokcxdbg)
    {
        ctx->tokcxdbg->dbgcxlin = &child->linflin;
        child->linflin.linid = ctx->tokcxdbg->dbgcxfid++;
    }

    /* remember my C-mode setting */
    if (ctx->tokcxflg & TOKCXFCMODE)
        ctx->tokcxlin->linflg |= LINFCMODE;
    else
        ctx->tokcxlin->linflg &= ~LINFCMODE;
    
    child->linflin.linpar = ctx->tokcxlin;   /* remember parent line source */
    ctx->tokcxlin = &child->linflin;   /* make the child the current source */
}